

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::AssertionResult::AssertionResult(AssertionResult *this,AssertionResult *param_1)

{
  pointer pcVar1;
  
  (this->m_info).macroName._M_dataplus._M_p = (pointer)&(this->m_info).macroName.field_2;
  pcVar1 = (param_1->m_info).macroName._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (param_1->m_info).macroName._M_string_length);
  (this->m_info).lineInfo.file._M_dataplus._M_p = (pointer)&(this->m_info).lineInfo.file.field_2;
  pcVar1 = (param_1->m_info).lineInfo.file._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_info).lineInfo,pcVar1,
             pcVar1 + (param_1->m_info).lineInfo.file._M_string_length);
  (this->m_info).lineInfo.line = (param_1->m_info).lineInfo.line;
  (this->m_info).capturedExpression._M_dataplus._M_p =
       (pointer)&(this->m_info).capturedExpression.field_2;
  pcVar1 = (param_1->m_info).capturedExpression._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_info).capturedExpression,pcVar1,
             pcVar1 + (param_1->m_info).capturedExpression._M_string_length);
  (this->m_info).resultDisposition = (param_1->m_info).resultDisposition;
  (this->m_resultData).reconstructedExpression._M_dataplus._M_p =
       (pointer)&(this->m_resultData).reconstructedExpression.field_2;
  pcVar1 = (param_1->m_resultData).reconstructedExpression._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_resultData,pcVar1,
             pcVar1 + (param_1->m_resultData).reconstructedExpression._M_string_length);
  (this->m_resultData).message._M_dataplus._M_p = (pointer)&(this->m_resultData).message.field_2;
  pcVar1 = (param_1->m_resultData).message._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_resultData).message,pcVar1,
             pcVar1 + (param_1->m_resultData).message._M_string_length);
  (this->m_resultData).resultType = (param_1->m_resultData).resultType;
  return;
}

Assistant:

AssertionResult( AssertionResult const& )              = default;